

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void perfetto::ipc::HostImpl::SendFrame(ClientConnection *client,Frame *frame,int fd)

{
  uint __errnum;
  code *pcVar1;
  bool bVar2;
  char *fname;
  uint *puVar3;
  char *pcVar4;
  Frame *frame_00;
  string buf;
  
  base::CrashKey::Set((CrashKey *)(anonymous_namespace)::g_crash_key_uid,
                      (ulong)((client->sock)._M_t.
                              super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                              .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>.
                             _M_head_impl)->peer_uid_);
  BufferedFrameDeserializer::Serialize_abi_cxx11_(&buf,(BufferedFrameDeserializer *)frame,frame_00);
  bVar2 = base::UnixSocket::Send
                    ((client->sock)._M_t.
                     super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                     .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl,
                     buf._M_dataplus._M_p,buf._M_string_length,fd);
  if ((!bVar2) &&
     (((client->sock)._M_t.
       super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
       .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl)->state_ ==
      kConnected)) {
    fname = base::Basename(
                          "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                          );
    puVar3 = (uint *)__errno_location();
    __errnum = *puVar3;
    pcVar4 = strerror(__errnum);
    base::LogMessage(kLogError,fname,0x112d9,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(res || !client->sock->is_connected())",(ulong)__errnum,pcVar4);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  ::std::__cxx11::string::~string((string *)&buf);
  (anonymous_namespace)::g_crash_key_uid._16_8_ = 0;
  (anonymous_namespace)::g_crash_key_uid[1] = 0;
  return;
}

Assistant:

void HostImpl::SendFrame(ClientConnection* client, const Frame& frame, int fd) {
  auto peer_uid = GetPosixPeerUid(client->sock.get());
  auto scoped_key = g_crash_key_uid.SetScoped(static_cast<int64_t>(peer_uid));

  std::string buf = BufferedFrameDeserializer::Serialize(frame);

  // When a new Client connects in OnNewClientConnection we set a timeout on
  // Send (see call to SetTxTimeout).
  //
  // The old behaviour was to do a blocking I/O call, which caused crashes from
  // misbehaving producers (see b/169051440).
  bool res = client->sock->Send(buf.data(), buf.size(), fd);
  // If we timeout |res| will be false, but the UnixSocket will have called
  // UnixSocket::ShutDown() and thus |is_connected()| is false.
  PERFETTO_CHECK(res || !client->sock->is_connected());
}